

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Transaction::GetTxInIndex(Transaction *this,Txid *txid,uint32_t vout)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  AbstractTxIn *pAVar4;
  undefined8 uVar5;
  string *message;
  CfdError in_stack_ffffffffffffff3c;
  uint32_t in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  undefined1 local_91 [33];
  CfdSourceLocation local_70;
  Txid local_48;
  ulong local_28;
  size_t i;
  Txid *pTStack_18;
  uint32_t vout_local;
  Txid *txid_local;
  Transaction *this_local;
  
  local_28 = 0;
  i._4_4_ = vout;
  pTStack_18 = txid;
  txid_local = (Txid *)this;
  while( true ) {
    uVar1 = local_28;
    sVar3 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
    if (sVar3 <= uVar1) {
      local_70.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                   ,0x2f);
      local_70.filename = local_70.filename + 1;
      local_70.line = 0x201;
      local_70.funcname = "GetTxInIndex";
      logger::warn<>(&local_70,"Txid is not found.");
      uVar5 = __cxa_allocate_exception(0x30);
      message = (string *)local_91;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)(local_91 + 1),"Txid is not found.",(allocator *)message);
      CfdException::CfdException
                ((CfdException *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c,message);
      __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pAVar4 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                        (&this->vin_,local_28)->super_AbstractTxIn;
    AbstractTxIn::GetTxid(&local_48,pAVar4);
    bVar2 = Txid::Equals(&local_48,pTStack_18);
    in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 & 0xffffff;
    if (bVar2) {
      pAVar4 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                          (&this->vin_,local_28)->super_AbstractTxIn;
      in_stack_ffffffffffffff40 = AbstractTxIn::GetVout(pAVar4);
      in_stack_ffffffffffffff44 =
           CONCAT13(in_stack_ffffffffffffff40 == i._4_4_,(int3)in_stack_ffffffffffffff44);
    }
    in_stack_ffffffffffffff3c =
         CONCAT13((char)(in_stack_ffffffffffffff44 >> 0x18),(int3)in_stack_ffffffffffffff3c);
    Txid::~Txid((Txid *)0x4360b6);
    if ((in_stack_ffffffffffffff3c & 0x1000000) != kCfdSuccess) break;
    local_28 = local_28 + 1;
  }
  return (uint32_t)local_28;
}

Assistant:

uint32_t Transaction::GetTxInIndex(const Txid &txid, uint32_t vout) const {
  for (size_t i = 0; i < vin_.size(); ++i) {
    if (vin_[i].GetTxid().Equals(txid) && vin_[i].GetVout() == vout) {
      return static_cast<uint32_t>(i);
    }
  }
  warn(CFD_LOG_SOURCE, "Txid is not found.");
  throw CfdException(kCfdIllegalArgumentError, "Txid is not found.");
}